

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O2

void __thiscall amrex::FabArray<amrex::TagBox>::~FabArray(FabArray<amrex::TagBox> *this)

{
  ~FabArray(this);
  operator_delete(this,0x180);
  return;
}

Assistant:

FabArray<FAB>::~FabArray ()
{
    m_FA_stats.recordDelete();
    clear();
}